

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O3

DynamicRectMatrix<double> __thiscall
OpenMD::Polynomial<double>::CreateCompanion(Polynomial<double> *this)

{
  _Rb_tree_node_base *p_Var1;
  _Rb_tree_node_base *p_Var2;
  long lVar3;
  _Base_ptr *pp_Var4;
  _Rb_tree_node_base *p_Var5;
  _Rb_tree_node_base *p_Var6;
  ulong extraout_RDX;
  long in_RSI;
  ulong uVar7;
  int j;
  ulong uVar8;
  ulong uVar9;
  _Base_ptr p_Var10;
  uint nrow;
  ulong uVar11;
  _Base_ptr p_Var12;
  double dVar13;
  _Base_ptr p_Var14;
  DynamicRectMatrix<double> DVar15;
  
  p_Var1 = (_Rb_tree_node_base *)(in_RSI + 8);
  uVar11 = 0;
  for (p_Var5 = *(_Rb_tree_node_base **)(in_RSI + 0x18); nrow = (uint)uVar11, p_Var5 != p_Var1;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    if ((int)nrow < (int)p_Var5[1]._M_color) {
      uVar11 = (ulong)p_Var5[1]._M_color;
    }
  }
  DynamicRectMatrix<double>::DynamicRectMatrix((DynamicRectMatrix<double> *)this,nrow,nrow);
  p_Var5 = *(_Rb_tree_node_base **)(in_RSI + 0x10);
  p_Var12 = (_Base_ptr)0x0;
  p_Var6 = p_Var1;
  p_Var14 = p_Var5;
  uVar8 = extraout_RDX;
  if (p_Var5 != (_Rb_tree_node_base *)0x0) {
    do {
      p_Var2 = p_Var14 + 1;
      if ((int)nrow <= (int)p_Var2->_M_color) {
        p_Var6 = p_Var14;
      }
      pp_Var4 = &p_Var14->_M_left;
      p_Var14 = pp_Var4[(int)p_Var2->_M_color < (int)nrow];
    } while (pp_Var4[(int)p_Var2->_M_color < (int)nrow] != (_Base_ptr)0x0);
    uVar8 = 0;
    if ((p_Var6 != p_Var1) && ((int)p_Var6[1]._M_color <= (int)nrow)) {
      p_Var12 = p_Var6[1]._M_parent;
    }
  }
  if (0 < (int)nrow) {
    uVar7 = 0;
    do {
      lVar3 = *(long *)&(this->polyPairMap_)._M_t._M_impl;
      uVar8 = 0;
      do {
        dVar13 = 1.0;
        uVar9 = uVar8;
        if (uVar7 - uVar8 == 1) {
LAB_00224683:
          *(double *)(*(long *)(lVar3 + uVar7 * 8) + uVar9 * 8) = dVar13;
        }
        else if (uVar8 == nrow - 1) {
          p_Var14 = (_Base_ptr)0x0;
          p_Var6 = p_Var1;
          p_Var10 = p_Var5;
          if (p_Var5 != (_Rb_tree_node_base *)0x0) {
            do {
              p_Var2 = p_Var10 + 1;
              if ((long)uVar7 <= (long)(int)p_Var2->_M_color) {
                p_Var6 = p_Var10;
              }
              pp_Var4 = &p_Var10->_M_left;
              p_Var10 = pp_Var4[(long)(int)p_Var2->_M_color < (long)uVar7];
            } while (pp_Var4[(long)(int)p_Var2->_M_color < (long)uVar7] != (_Base_ptr)0x0);
            if ((p_Var6 != p_Var1) && ((long)(int)p_Var6[1]._M_color <= (long)uVar7)) {
              p_Var14 = p_Var6[1]._M_parent;
            }
          }
          dVar13 = -(double)p_Var14 / (double)p_Var12;
          uVar9 = (ulong)(nrow - 1);
          goto LAB_00224683;
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != uVar11);
      uVar7 = uVar7 + 1;
      uVar8 = uVar11;
    } while (uVar7 != uVar11);
  }
  DVar15.nrow_ = (int)uVar8;
  DVar15.ncol_ = (int)(uVar8 >> 0x20);
  DVar15.data_ = (double **)this;
  return DVar15;
}

Assistant:

DynamicRectMatrix<Real> CreateCompanion() {
      int rank = degree();
      DynamicRectMatrix<Real> mat(rank, rank);
      Real majorCoeff = getCoefficient(rank);
      for (int i = 0; i < rank; ++i) {
        for (int j = 0; j < rank; ++j) {
          if (i - j == 1) {
            mat(i, j) = 1;
          } else if (j == rank - 1) {
            mat(i, j) = -1 * getCoefficient(i) / majorCoeff;
          }
        }
      }
      return mat;
    }